

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_iplus2(LispPTR tosm1,LispPTR tos)

{
  ushort uVar1;
  LispPTR *pLVar2;
  float *pfVar3;
  uint *NAddr;
  LispPTR LVar4;
  uint uVar5;
  LispPTR LVar6;
  
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar4 = tos | 0xffff0000;
  }
  else if ((tos & 0xfff0000) == 0xe0000) {
    LVar4 = tos & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tos >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar3 = (float *)NativeAligned4FromLAddr(tos);
      if (*pfVar3 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar4 = (LispPTR)*pfVar3;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar2 = NativeAligned4FromLAddr(tos);
      LVar4 = *pLVar2;
    }
  }
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar6 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar6 = tosm1 & 0xffff;
  }
  else {
    uVar1 = *(ushort *)((ulong)(tosm1 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 3) {
      pfVar3 = (float *)NativeAligned4FromLAddr(tosm1);
      if (*pfVar3 != 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      LVar6 = (LispPTR)*pfVar3;
    }
    else {
      if (uVar1 != 2) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar2 = NativeAligned4FromLAddr(tosm1);
      LVar6 = *pLVar2;
    }
  }
  uVar5 = LVar4 + LVar6;
  if (SCARRY4(LVar4,LVar6)) {
    MachineState.errorexit = 1;
    MachineState.tosvalue = tos;
    return 0xffffffff;
  }
  if ((uVar5 & 0xffff0000) == 0xffff0000) {
    return uVar5 & 0xffff | 0xf0000;
  }
  if ((uVar5 & 0xffff0000) != 0) {
    NAddr = (uint *)createcell68k(2);
    *NAddr = uVar5;
    LVar4 = LAddrFromNative(NAddr);
    return LVar4;
  }
  return uVar5 | 0xe0000;
}

Assistant:

LispPTR N_OP_iplus2(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_IGETNUMBER(tos, arg1, doufn);
  N_IGETNUMBER(tosm1, arg2, doufn);

#ifdef USE_OVERFLOW_BUILTINS

  if (__builtin_sadd_overflow(arg1, arg2, &result)) {
    ERROR_EXIT(tos);
  }
  N_ARITH_SWITCH(result);

#else

  /* UB: signed integer overflow: 2147483647 + 2147483647 cannot be represented in type 'int' */
  result = arg1 + arg2;
  if (((arg1 >= 0) == (arg2 >= 0)) && ((result >= 0) != (arg1 >= 0))) { ERROR_EXIT(tos); }
  N_ARITH_SWITCH(result);

#endif

doufn:
  ERROR_EXIT(tos);
}